

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,minstd_rand *rng)

{
  int32_t id;
  bool bVar1;
  bool bVar2;
  entry_type eVar3;
  uint uVar4;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  int iVar5;
  Dictionary *this_00;
  int iVar6;
  double dVar7;
  string token;
  undefined1 local_50 [32];
  
  local_50._0_8_ = local_50 + 0x10;
  local_50._8_8_ = 0;
  local_50[0x10] = '\0';
  reset(this,in);
  this_00 = (Dictionary *)words;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(words);
  iVar5 = 0;
  do {
    bVar2 = readWord(this_00,in,(string *)local_50);
    if (!bVar2) break;
    this_00 = this;
    uVar4 = find(this,(string *)local_50);
    id = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4];
    if (id < 0) {
      bVar2 = false;
    }
    else {
      this_00 = this;
      eVar3 = getType(this,id);
      if (eVar3 == word) {
        dVar7 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                          (rng);
        this_00 = this;
        bVar2 = discard(this,id,(float)(dVar7 + 0.0));
        if (!bVar2) {
          this_00 = (Dictionary *)words;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(words,(string *)local_50);
        }
      }
      iVar6 = iVar5 + 1;
      bVar2 = true;
      bVar1 = iVar5 < 0x400;
      iVar5 = iVar6;
      if (bVar1) {
        if (local_50._8_8_ == DAT_00128a98) {
          if (local_50._8_8_ != 0) {
            this_00 = (Dictionary *)local_50._0_8_;
            iVar6 = bcmp((void *)local_50._0_8_,EOS_abi_cxx11_,local_50._8_8_);
            bVar2 = iVar6 == 0;
          }
        }
        else {
          bVar2 = false;
        }
      }
    }
  } while (!bVar2);
  if ((Dictionary *)local_50._0_8_ != (Dictionary *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  return iVar5;
}

Assistant:

int32_t Dictionary::getLine(std::istream& in,
                                std::vector<std::string>& words,
                                std::minstd_rand& rng) const {
      std::uniform_real_distribution<> uniform(0, 1);
      std::string token;
      int32_t ntokens = 0;

      reset(in);
      words.clear();
      while (readWord(in, token)) {
        int32_t h = find(token);
        int32_t wid = word2int_[h];
        if (wid < 0) continue;

        ntokens++;
        if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
          words.push_back(token);
        }
        if (ntokens > MAX_LINE_SIZE || token == EOS) break;
      }
      return ntokens;
    }